

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *
vkt::pipeline::createTestQuadMosaic
          (vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
           *__return_storage_ptr__,VkImageViewType viewType)

{
  float *pfVar1;
  pointer pVVar2;
  size_t quadNdx;
  long lVar3;
  long lVar4;
  bool bVar5;
  _Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> _Stack_28;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(viewType) {
  case VK_IMAGE_VIEW_TYPE_1D:
  case VK_IMAGE_VIEW_TYPE_2D:
    createFullscreenQuad();
    break;
  case VK_IMAGE_VIEW_TYPE_3D:
    createQuadMosaic((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      *)&_Stack_28,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
    _M_move_assign(__return_storage_ptr__,&_Stack_28);
    std::_Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
    ~_Vector_base(&_Stack_28);
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(__return_storage_ptr__->
                  super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5;
    pfVar1 = (pVVar2->texCoord).m_data + 2;
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
      *pfVar1 = *pfVar1 / 5.0 + -0.001;
      pfVar1 = pfVar1 + 8;
    }
    return __return_storage_ptr__;
  case VK_IMAGE_VIEW_TYPE_CUBE:
    createQuadMosaicCube();
    break;
  case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
    createQuadMosaic((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      *)&_Stack_28,2,3);
    std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
    _M_move_assign(__return_storage_ptr__,&_Stack_28);
    std::_Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
    ~_Vector_base(&_Stack_28);
    pVVar2 = (__return_storage_ptr__->
             super__Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      for (lVar4 = 0x14; lVar4 != 0xd4; lVar4 = lVar4 + 0x20) {
        *(float *)((long)(pVVar2->position).m_data + lVar4) = (float)lVar3;
      }
      pVVar2 = pVVar2 + 6;
    }
    return __return_storage_ptr__;
  case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
    createQuadMosaic((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>
                      *)&_Stack_28,2,3);
    break;
  case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
    createQuadMosaicCubeArray
              ((vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_> *)
               &_Stack_28,(int *)&DAT_00951dc0);
    break;
  default:
    goto switchD_004c4dda_default;
  }
  std::vector<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
  _M_move_assign(__return_storage_ptr__,&_Stack_28);
  std::_Vector_base<vkt::pipeline::Vertex4Tex4,_std::allocator<vkt::pipeline::Vertex4Tex4>_>::
  ~_Vector_base(&_Stack_28);
switchD_004c4dda_default:
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4Tex4> createTestQuadMosaic (vk::VkImageViewType viewType)
{
	std::vector<Vertex4Tex4> vertices;

	switch (viewType)
	{
		case vk::VK_IMAGE_VIEW_TYPE_1D:
		case vk::VK_IMAGE_VIEW_TYPE_2D:
			vertices = createFullscreenQuad();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			vertices = createQuadMosaic(2, 3);

			// Set up array indices
			for (size_t quadNdx = 0; quadNdx < 6; quadNdx++)
				for (size_t vertexNdx = 0; vertexNdx < 6; vertexNdx++)
					vertices[quadNdx * 6 + vertexNdx].texCoord.y() = (float)quadNdx;

			break;

		case vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			vertices = createQuadMosaic(2, 3);
			break;

		case vk::VK_IMAGE_VIEW_TYPE_3D:
			vertices = createQuadMosaic(2, 3);

			// Use z between 0.0 and 1.0.
			for (size_t vertexNdx = 0; vertexNdx < vertices.size(); vertexNdx++)
			{
				vertices[vertexNdx].texCoord.z() /= 5.0f;
				vertices[vertexNdx].texCoord.z() -= 0.001f; // Substract small value to correct floating-point errors at the boundaries between slices
			}

			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE:
			vertices = createQuadMosaicCube();
			break;

		case vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			{
				int faceArrayIndices[6] = { 0, 1, 2, 3, 4, 5 };
				vertices = createQuadMosaicCubeArray(faceArrayIndices);
			}
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return vertices;
}